

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

Matrix<double,_3,_3> * __thiscall
gl4cts::Math::outerProduct<3,3>
          (Matrix<double,_3,_3> *__return_storage_ptr__,Math *this,Vector<double,_3> *left,
          Vector<double,_3> *right)

{
  int row;
  long lVar1;
  double *pdVar2;
  long lVar3;
  long lVar4;
  undefined1 *puVar5;
  uint uVar6;
  Matrix<double,_1,_3> right_mat;
  Matrix<double,_3,_1> left_mat;
  Matrix<double,_1,_3> local_98;
  Matrix<double,_3,_1> local_78;
  undefined1 local_60 [72];
  
  lVar1 = 0;
  do {
    uVar6 = 0x3ff00000;
    if (lVar1 != 0) {
      uVar6 = 0;
    }
    local_78.m_data.m_data[0].m_data[lVar1] = (double)((ulong)uVar6 << 0x20);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  lVar1 = 0;
  do {
    uVar6 = 0x3ff00000;
    if (lVar1 != 0) {
      uVar6 = 0;
    }
    local_98.m_data.m_data[lVar1].m_data[0] = (double)((ulong)uVar6 << 0x20);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  (__return_storage_ptr__->m_data).m_data[2].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[2] = 0.0;
  lVar1 = 0;
  lVar3 = 0;
  pdVar2 = (double *)__return_storage_ptr__;
  do {
    lVar4 = 0;
    do {
      uVar6 = 0x3ff00000;
      if (lVar1 != lVar4) {
        uVar6 = 0;
      }
      *(ulong *)((long)pdVar2 + lVar4) = (ulong)uVar6 << 0x20;
      lVar4 = lVar4 + 0x18;
    } while (lVar4 != 0x48);
    lVar3 = lVar3 + 1;
    pdVar2 = pdVar2 + 1;
    lVar1 = lVar1 + 0x18;
  } while (lVar3 != 3);
  local_78.m_data.m_data[0].m_data[2] = *(double *)(this + 0x10);
  local_78.m_data.m_data[0].m_data[0] = *(double *)this;
  local_78.m_data.m_data[0].m_data[1] = *(double *)(this + 8);
  local_98.m_data.m_data[0].m_data[0] = (double  [1])left->m_data[0];
  local_98.m_data.m_data[1].m_data[0] = (double  [1])left->m_data[1];
  local_98.m_data.m_data[2].m_data[0] = (double  [1])left->m_data[2];
  puVar5 = local_60;
  tcu::operator*(&local_78,&local_98);
  lVar1 = 0;
  pdVar2 = (double *)__return_storage_ptr__;
  do {
    lVar3 = 0;
    do {
      *(undefined8 *)((long)pdVar2 + lVar3) = *(undefined8 *)(puVar5 + lVar3);
      lVar3 = lVar3 + 0x18;
    } while (lVar3 != 0x48);
    lVar1 = lVar1 + 1;
    pdVar2 = pdVar2 + 1;
    puVar5 = puVar5 + 8;
  } while (lVar1 != 3);
  return __return_storage_ptr__;
}

Assistant:

static tcu::Matrix<glw::GLdouble, Rows, Cols> outerProduct(const tcu::Vector<glw::GLdouble, Rows>& left,
														   const tcu::Vector<glw::GLdouble, Cols>& right)
{
	tcu::Matrix<glw::GLdouble, Rows, 1>	left_mat;
	tcu::Matrix<glw::GLdouble, 1, Cols>	right_mat;
	tcu::Matrix<glw::GLdouble, Rows, Cols> result;

	for (glw::GLuint i = 0; i < Rows; ++i)
	{
		left_mat(i, 0) = left[i];
	}

	for (glw::GLuint i = 0; i < Cols; ++i)
	{
		right_mat(0, i) = right[i];
	}

	result = left_mat * right_mat;

	return result;
}